

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O2

string * __thiscall
CreateCharacterState::ShowStats_abi_cxx11_
          (string *__return_storage_ptr__,CreateCharacterState *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"1 Strength      : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_str);
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"2 Endurance     : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_end);
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"3 Intelligence  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_int);
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"4 Dexterity     : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_dex);
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"5 Skill         : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_skill);
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"Points remaining: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_att_points);
  std::operator<<(poVar1,"\r\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string CreateCharacterState::ShowStats() {
    std::stringstream ss;
    ss << "1 Strength      : " << m_str << "\r\n";
    ss << "2 Endurance     : " << m_end << "\r\n";
    ss << "3 Intelligence  : " << m_int << "\r\n";
    ss << "4 Dexterity     : " << m_dex << "\r\n";
    ss << "5 Skill         : " << m_skill << "\r\n";
    ss << "Points remaining: " << m_att_points << "\r\n";
    return ss.str();
}